

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O0

void configureSphereProgram(void)

{
  (*glad_glProgramUniform1i)(g_gl.programs[2],g_gl.uniforms[6],g_framebuffer.samplesPerPass);
  (*glad_glProgramUniform1i)(g_gl.programs[2],g_gl.uniforms[7],4);
  (*glad_glProgramUniform1i)(g_gl.programs[2],g_gl.uniforms[8],3);
  (*glad_glProgramUniform1i)(g_gl.programs[2],g_gl.uniforms[9],5);
  (*glad_glProgramUniform1i)(g_gl.programs[2],g_gl.uniforms[0xb],g_sphere.shading.merl.id);
  (*glad_glProgramUniform1f)(g_gl.programs[2],g_gl.uniforms[10],g_sphere.shading.ggxAlpha);
  return;
}

Assistant:

void configureSphereProgram()
{
    glProgramUniform1i(g_gl.programs[PROGRAM_SPHERE],
                       g_gl.uniforms[UNIFORM_SPHERE_SAMPLES_PER_PASS],
                       g_framebuffer.samplesPerPass);
    glProgramUniform1i(g_gl.programs[PROGRAM_SPHERE],
                       g_gl.uniforms[UNIFORM_SPHERE_NPF_SAMPLER],
                       TEXTURE_NPF);
    glProgramUniform1i(g_gl.programs[PROGRAM_SPHERE],
                       g_gl.uniforms[UNIFORM_SPHERE_ENVMAP_SAMPLER],
                       TEXTURE_ENVMAP);
    glProgramUniform1i(g_gl.programs[PROGRAM_SPHERE],
                       g_gl.uniforms[UNIFORM_SPHERE_MERL_SAMPLER],
                       TEXTURE_MERL);
    glProgramUniform1i(g_gl.programs[PROGRAM_SPHERE],
                       g_gl.uniforms[UNIFORM_SPHERE_MERL_ID],
                       g_sphere.shading.merl.id);
    glProgramUniform1f(g_gl.programs[PROGRAM_SPHERE],
                       g_gl.uniforms[UNIFORM_SPHERE_ALPHA],
                       g_sphere.shading.ggxAlpha);
}